

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  undefined8 this_00;
  XmlWriter *this_01;
  long in_FS_OFFSET;
  allocator local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  undefined1 local_b0 [16];
  string local_a0;
  string local_80;
  string local_60;
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testRunEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testRunStats);
  std::__cxx11::string::string(local_40,"OverallResults",&local_b1);
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)this_01,(XmlFormatting)local_40);
  std::__cxx11::string::string((string *)&local_60,"successes",&local_b2);
  this_00 = local_b0._0_8_;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_b0._0_8_,&local_60,&(testRunStats->totals).assertions.passed);
  std::__cxx11::string::string((string *)&local_80,"failures",&local_b3);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,&local_80,&(testRunStats->totals).assertions.failed);
  std::__cxx11::string::string((string *)(local_b0 + 0x10),"expectedFailures",&local_b4);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)(local_b0 + 0x10),
             &(testRunStats->totals).assertions.failedButOk);
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_40,"OverallResultsCases",&local_b1);
  XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)this_01,(XmlFormatting)local_40);
  std::__cxx11::string::string((string *)&local_60,"successes",&local_b2);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_b0._0_8_,&local_60,&(testRunStats->totals).testCases.passed);
  std::__cxx11::string::string((string *)&local_80,"failures",&local_b3);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_b0._0_8_,&local_80,&(testRunStats->totals).testCases.failed);
  std::__cxx11::string::string((string *)(local_b0 + 0x10),"expectedFailures",&local_b4);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_b0._0_8_,(string *)(local_b0 + 0x10),
             &(testRunStats->totals).testCases.failedButOk);
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
  std::__cxx11::string::~string(local_40);
  XmlWriter::endElement(this_01,Newline|Indent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testRunStats.totals.assertions.passed )
            .writeAttribute( "failures", testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testRunStats.totals.testCases.passed )
            .writeAttribute( "failures", testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testRunStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }